

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Var * __thiscall
kratos::Generator::var
          (Generator *this,string *var_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  undefined1 auVar1 [8];
  uint32_t uVar2;
  iterator iVar3;
  VarException *this_00;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *__args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_80;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  undefined1 local_60 [8];
  shared_ptr<kratos::Var> p;
  undefined1 local_40 [8];
  shared_ptr<kratos::Var> v_p;
  uint32_t width_local;
  bool is_signed_local;
  
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = width;
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&(this->vars_)._M_t,var_name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    __args_1 = &local_78;
    local_60 = (undefined1  [8])0x0;
    local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::Var,std::allocator<kratos::Var>,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(Var **)local_60,
               (allocator<kratos::Var> *)local_40,(Generator **)__args_1,var_name,
               (uint *)&v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               size,(bool *)((long)&v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi + 7));
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::Var,kratos::Var>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_60,(Var *)local_60);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>&>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
                *)&this->vars_,
               (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)var_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
               (shared_ptr<kratos::Var> *)__args_1);
    auVar1 = local_60;
  }
  else {
    get_var((Generator *)local_40,(string *)this);
    auVar1 = local_40;
    uVar2 = (*((IRNode *)local_40)->_vptr_IRNode[7])(local_40);
    if ((uVar2 != (uint32_t)
                  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       || (p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          *(bool *)((long)auVar1 + 0xf0) !=
          (bool)v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _7_1_)) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(var_name->_M_dataplus)._M_p;
      local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)var_name->_M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_78;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_60,(detail *)"redefinition of {0} with different width/sign",
                 format_str,args);
      local_80 = (Var *)local_40;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_80;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_78,__l,
                 (allocator_type *)
                 ((long)&v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi + 6));
      VarException::VarException(this_00,(string *)local_60,&local_78);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (Var *)auVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, const std::vector<uint32_t> &size,
                    bool is_signed) {
    if (vars_.find(var_name) != vars_.end()) {
        auto v_p = get_var(var_name);
        if (v_p->width() != width || v_p->is_signed() != is_signed)
            throw VarException(::format("redefinition of {0} with different width/sign", var_name),
                               {v_p.get()});
        return *v_p;
    }
    auto p = std::make_shared<Var>(this, var_name, width, size, is_signed);
    vars_.emplace(var_name, p);
    return *p;
}